

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
VectorInstance::receive
          (string *__return_storage_ptr__,VectorInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  undefined8 *puVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)message_name);
  if (iVar1 == 0) {
    op_get(__return_storage_ptr__,this,arguments);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)message_name);
    if (iVar1 == 0) {
      op_isEmpty(__return_storage_ptr__,this,arguments);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)message_name);
      if (iVar1 == 0) {
        op_contains(__return_storage_ptr__,this,arguments);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)message_name);
        if (iVar1 == 0) {
          op_contains_fromIndex(__return_storage_ptr__,this,arguments);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)message_name);
          if (iVar1 == 0) {
            op_count(__return_storage_ptr__,this,arguments);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)message_name);
            if (iVar1 == 0) {
              op_atIndex(__return_storage_ptr__,this,arguments);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)message_name);
              if (iVar1 == 0) {
                op_firstIndexOf(__return_storage_ptr__,this,arguments);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)message_name);
                if (iVar1 == 0) {
                  op_firstIndexOf_fromIndex(__return_storage_ptr__,this,arguments);
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)message_name);
                  if (iVar1 == 0) {
                    op_allIndexesOf(__return_storage_ptr__,this,arguments);
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)message_name);
                    if (iVar1 == 0) {
                      op_size(__return_storage_ptr__,this,arguments);
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)message_name);
                      if (iVar1 == 0) {
                        op_first(__return_storage_ptr__,this,arguments);
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)message_name);
                        if (iVar1 == 0) {
                          op_last(__return_storage_ptr__,this,arguments);
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)message_name);
                          if (iVar1 == 0) {
                            op_sliceFromIndex(__return_storage_ptr__,this,arguments);
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)message_name);
                            if (iVar1 == 0) {
                              op_sliceFromIndex_toIndex(__return_storage_ptr__,this,arguments);
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)message_name);
                              if (iVar1 == 0) {
                                op_pushBack(__return_storage_ptr__,this,arguments);
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)message_name);
                                if (iVar1 == 0) {
                                  op_pushFront(__return_storage_ptr__,this,arguments);
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)message_name);
                                  if (iVar1 == 0) {
                                    op_popBack(__return_storage_ptr__,this,arguments);
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare((char *)message_name);
                                    if (iVar1 == 0) {
                                      op_popFront(__return_storage_ptr__,this,arguments);
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare((char *)message_name);
                                      if (iVar1 == 0) {
                                        op_popAtIndex(__return_storage_ptr__,this,arguments);
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare((char *)message_name);
                                        if (iVar1 == 0) {
                                          op_insert_beforeIndex
                                                    (__return_storage_ptr__,this,arguments);
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare
                                                            ((char *)message_name);
                                          if (iVar1 == 0) {
                                            op_eraseFromIndex(__return_storage_ptr__,this,arguments)
                                            ;
                                          }
                                          else {
                                            iVar1 = std::__cxx11::string::compare
                                                              ((char *)message_name);
                                            if (iVar1 == 0) {
                                              op_eraseFromIndex_toIndex
                                                        (__return_storage_ptr__,this,arguments);
                                            }
                                            else {
                                              iVar1 = std::__cxx11::string::compare
                                                                ((char *)message_name);
                                              if (iVar1 == 0) {
                                                op_removeFirst(__return_storage_ptr__,this,arguments
                                                              );
                                              }
                                              else {
                                                iVar1 = std::__cxx11::string::compare
                                                                  ((char *)message_name);
                                                if (iVar1 == 0) {
                                                  op_removeFirst_fromIndex
                                                            (__return_storage_ptr__,this,arguments);
                                                }
                                                else {
                                                  iVar1 = std::__cxx11::string::compare
                                                                    ((char *)message_name);
                                                  if (iVar1 == 0) {
                                                    op_removeAll(__return_storage_ptr__,this,
                                                                 arguments);
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)message_name);
                                                    if (iVar1 == 0) {
                                                      op_replaceFirst_with
                                                                (__return_storage_ptr__,this,
                                                                 arguments);
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)message_name);
                                                      if (iVar1 == 0) {
                                                        op_replaceFirst_fromIndex_with
                                                                  (__return_storage_ptr__,this,
                                                                   arguments);
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)message_name);
                                                        if (iVar1 == 0) {
                                                          op_replaceAll_with(__return_storage_ptr__,
                                                                             this,arguments);
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)message_name);
                                                          if (iVar1 == 0) {
                                                            op_sort(__return_storage_ptr__,this,
                                                                    arguments);
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)message_name)
                                                            ;
                                                            if (iVar1 == 0) {
                                                              op_reverse(__return_storage_ptr__,this
                                                                         ,arguments);
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)
                                                  message_name);
                                                  if (iVar1 != 0) {
                                                    puVar2 = (undefined8 *)
                                                             __cxa_allocate_exception(8);
                                                    *puVar2 = "RuntimeError: invalid message.";
                                                    __cxa_throw(puVar2,&char_const*::typeinfo,0);
                                                  }
                                                  op_clear(__return_storage_ptr__,this,arguments);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VectorInstance::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "get")
        return op_get(arguments);
    if (message_name == "isEmpty?")
        return op_isEmpty(arguments);
    if (message_name == "contains?")
        return op_contains(arguments);
    if (message_name == "contains?fromIndex:")
        return op_contains_fromIndex(arguments);
    if (message_name == "count:")
        return op_count(arguments);
    if (message_name == "atIndex:")
        return op_atIndex(arguments);
    if (message_name == "firstIndexOf:")
        return op_firstIndexOf(arguments);
    if (message_name == "firstIndexOf:fromIndex:")
        return op_firstIndexOf_fromIndex(arguments);
    if (message_name == "allIndexesOf:")
        return op_allIndexesOf(arguments);
    if (message_name == "size")
        return op_size(arguments);
    if (message_name == "first:")
        return op_first(arguments);
    if (message_name == "last:")
        return op_last(arguments);
    if (message_name == "sliceFromIndex:")
        return op_sliceFromIndex(arguments);
    if (message_name == "sliceFromIndex:toIndex:")
        return op_sliceFromIndex_toIndex(arguments);
    if (message_name == "pushBack:")
        return op_pushBack(arguments);
    if (message_name == "pushFront:")
        return op_pushFront(arguments);
    if (message_name == "popBack")
        return op_popBack(arguments);
    if (message_name == "popFront")
        return op_popFront(arguments);
    if (message_name == "popAtIndex:")
        return op_popAtIndex(arguments);
    if (message_name == "insert:beforeIndex:")
        return op_insert_beforeIndex(arguments);
    if (message_name == "eraseFromIndex:")
        return op_eraseFromIndex(arguments);
    if (message_name == "eraseFromIndex:toIndex:")
        return op_eraseFromIndex_toIndex(arguments);
    if (message_name == "removeFirst:")
        return op_removeFirst(arguments);
    if (message_name == "removeFirst:fromIndex:")
        return op_removeFirst_fromIndex(arguments);
    if (message_name == "removeAll:")
        return op_removeAll(arguments);
    if (message_name == "replaceFirst:with:")
        return op_replaceFirst_with(arguments);
    if (message_name == "replaceFirst:fromIndex:with:")
        return op_replaceFirst_fromIndex_with(arguments);
    if (message_name == "replaceAll:with:")
        return op_replaceAll_with(arguments);
    if (message_name == "sort")
        return op_sort(arguments);
    if (message_name == "reverse")
        return op_reverse(arguments);
    if (message_name == "clear")
        return op_clear(arguments);
    throw EXC_INVALID_MESSAGE;
}